

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationShaderInputOutputTests.cpp
# Opt level: O3

TestStatus *
vkt::tessellation::anon_unknown_1::GLPosition::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseType caseType)

{
  TextureLevel referenceImage;
  ConstPixelBufferAccess local_40;
  
  tcu::TextureLevel::TextureLevel(&referenceImage);
  tcu::ImageIO::loadPNG
            (&referenceImage,context->m_testCtx->m_curArchive,
             "vulkan/data/tessellation/gl_position_ref.png");
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_40,&referenceImage);
  runTest(__return_storage_ptr__,context,1,3,3,VK_FORMAT_R32G32B32A32_SFLOAT,test::vertexData,0x30,
          &local_40);
  tcu::TextureLevel::~TextureLevel(&referenceImage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseType caseType)
{
	DE_UNREF(caseType);

	// Input vertex attribute data
	static const float vertexData[3*4] =
	{
		-0.8f, -0.7f, 0.1f, 0.7f,
		-0.5f,  0.4f, 0.2f, 0.5f,
		 0.3f,  0.2f, 0.3f, 0.45f
	};

	tcu::TextureLevel referenceImage;
	tcu::ImageIO::loadPNG(referenceImage, context.getTestContext().getArchive(), "vulkan/data/tessellation/gl_position_ref.png");

	const int numPrimitives = 1;
	const int inPatchSize   = 3;
	const int outPatchSize  = 3;

	return runTest(context, numPrimitives, inPatchSize, outPatchSize,
				   VK_FORMAT_R32G32B32A32_SFLOAT, vertexData, sizeof(vertexData), referenceImage.getAccess());
}